

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> __thiscall
wallet::MakeDatabase
          (wallet *this,path *path,DatabaseOptions *options,DatabaseStatus *status,
          bilingual_str *error)

{
  string original;
  string original_00;
  string original_01;
  string original_02;
  string original_03;
  string original_04;
  char cVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  _Optional_payload_base<wallet::DatabaseFormat> _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  byte bVar6;
  string *this_00;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffe58;
  _Head_base<0UL,_wallet::WalletDatabase_*,_false> in_stack_fffffffffffffe60;
  _Head_base<0UL,_wallet::WalletDatabase_*,_false> _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffe68;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8 [2];
  string local_b8 [2];
  bilingual_str local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)status;
  cVar1 = std::filesystem::symlink_status((path *)path);
  if (cVar1 == -1) {
    bVar4 = options->require_existing;
    if ((bool)bVar4 == true) {
      std::filesystem::__cxx11::path::string(local_b8,&path->super_path);
      tinyformat::format<std::__cxx11::string>
                (&local_118,
                 (tinyformat *)"Failed to load database path \'%s\'. Path does not exist.",
                 (char *)local_b8,args);
      original._M_string_length = (size_type)in_stack_fffffffffffffe60._M_head_impl;
      original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
      original.field_2 = in_stack_fffffffffffffe68;
      Untranslated(&local_78,original);
      bilingual_str::operator=(error,&local_78);
      bilingual_str::~bilingual_str(&local_78);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)local_b8);
      *status = FAILED_NOT_FOUND;
    }
    else {
LAB_009cba04:
      if ((bVar4 & 1) == 0) {
        if ((options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>.
            _M_payload.super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged == true) {
          _Var5 = (options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>
                  ._M_payload.super__Optional_payload_base<wallet::DatabaseFormat>;
          bVar6 = _Var5._M_engaged & 1;
          goto LAB_009cbb4c;
        }
LAB_009cbb78:
        MakeSQLiteDatabase((wallet *)&local_78,path,options,status,error);
LAB_009cbb94:
        *(pointer *)this = local_78.original._M_dataplus._M_p;
        goto LAB_009cbb9a;
      }
      std::filesystem::__cxx11::path::string(local_b8,&path->super_path);
      tinyformat::format<std::__cxx11::string>
                (&local_138,
                 (tinyformat *)
                 "Failed to load database path \'%s\'. Data is not in recognized format.",
                 (char *)local_b8,args);
      original_02._M_string_length = (size_type)in_stack_fffffffffffffe60._M_head_impl;
      original_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
      original_02.field_2 = in_stack_fffffffffffffe68;
      Untranslated(&local_78,original_02);
      bilingual_str::operator=(error,&local_78);
      bilingual_str::~bilingual_str(&local_78);
      this_00 = &local_138;
LAB_009cba61:
      std::__cxx11::string::~string((string *)this_00);
      std::__cxx11::string::~string((string *)local_b8);
      *status = FAILED_BAD_FORMAT;
    }
  }
  else {
    BDBDataFile((path *)&local_78,path);
    bVar2 = IsBDBFile((path *)&local_78);
    std::filesystem::__cxx11::path::~path((path *)&local_78);
    SQLiteDataFile((path *)&local_78,path);
    bVar3 = IsSQLiteFile((path *)&local_78);
    std::filesystem::__cxx11::path::~path((path *)&local_78);
    in_stack_fffffffffffffe60._M_head_impl = (WalletDatabase *)this;
    if (bVar3) {
      _Var5._M_payload = (_Storage<wallet::DatabaseFormat,_true>)0x1;
      _Var5._M_engaged = false;
      _Var5._5_3_ = 0;
      if (bVar2) {
        std::filesystem::__cxx11::path::string(local_b8,&path->super_path);
        tinyformat::format<std::__cxx11::string>
                  (local_f8,(tinyformat *)
                            "Failed to load database path \'%s\'. Data is in ambiguous format.",
                   (char *)local_b8,args);
        original_00._M_string_length = (size_type)this;
        original_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
        original_00.field_2 = in_stack_fffffffffffffe68;
        Untranslated(&local_78,original_00);
        bilingual_str::operator=(error,&local_78);
        bilingual_str::~bilingual_str(&local_78);
        std::__cxx11::string::~string((string *)local_f8);
        std::__cxx11::string::~string((string *)local_b8);
        *status = FAILED_BAD_FORMAT;
        goto LAB_009cba7a;
      }
    }
    else {
      _Var5._M_payload = (_Storage<wallet::DatabaseFormat,_true>)0x0;
      _Var5._M_engaged = false;
      _Var5._5_3_ = 0;
      if (!bVar2) {
        bVar4 = options->require_existing;
        goto LAB_009cba04;
      }
    }
    if (options->require_create != true) {
      bVar4 = (options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>.
              _M_payload.super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged;
      if ((bool)bVar4 != false) {
        _Var5._M_payload = (_Storage<wallet::DatabaseFormat,_true>)0x1;
        _Var5._M_engaged = false;
        _Var5._5_3_ = 0;
      }
      if ((bVar3 || (bool)bVar4 != true) ||
         (_Var5._M_payload = (_Storage<wallet::DatabaseFormat,_true>)0x0, _Var5._M_engaged = false,
         _Var5._5_3_ = 0,
         (options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>.
         _M_payload.super__Optional_payload_base<wallet::DatabaseFormat>._M_payload._M_value !=
         BERKELEY_RO)) {
        bVar4 = (options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>.
                _M_payload.super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged;
      }
      else {
        _Var5._M_payload = (_Storage<wallet::DatabaseFormat,_true>)0x2;
        _Var5._M_engaged = false;
        _Var5._5_3_ = 0;
      }
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71((int7)((ulong)args >> 8),bVar4);
      bVar6 = 1;
      if (((bVar4 & 1) == 0) ||
         ((bVar4 != 0 &&
          (_Var5._M_payload._M_value ==
           (options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>.
           _M_payload.super__Optional_payload_base<wallet::DatabaseFormat>._M_payload._M_value)))) {
LAB_009cbb4c:
        if ((bVar6 == 0) || (_Var5._M_payload._M_value == SQLITE)) goto LAB_009cbb78;
        if (_Var5._M_payload._M_value == BERKELEY_RO) {
          MakeBerkeleyRODatabase
                    ((path *)&local_78,(DatabaseOptions *)path,(DatabaseStatus *)options,
                     (bilingual_str *)status);
          goto LAB_009cbb94;
        }
        std::filesystem::__cxx11::path::string(local_b8,&path->super_path);
        tinyformat::format<std::__cxx11::string>
                  ((string *)&stack0xfffffffffffffe68,
                   (tinyformat *)
                   "Failed to open database path \'%s\'. Build does not support Berkeley DB database format."
                   ,(char *)local_b8,args);
        original_04._M_string_length = (size_type)in_stack_fffffffffffffe60._M_head_impl;
        original_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
        original_04.field_2 = in_stack_fffffffffffffe68;
        Untranslated(&local_78,original_04);
        bilingual_str::operator=(error,&local_78);
        bilingual_str::~bilingual_str(&local_78);
        this_00 = (string *)&stack0xfffffffffffffe68;
      }
      else {
        _Var7._M_head_impl = (WalletDatabase *)this;
        std::filesystem::__cxx11::path::string(local_b8,&path->super_path);
        tinyformat::format<std::__cxx11::string>
                  (&local_178,
                   (tinyformat *)
                   "Failed to load database path \'%s\'. Data is not in required format.",
                   (char *)local_b8,args);
        original_03._M_string_length = (size_type)_Var7._M_head_impl;
        original_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
        original_03.field_2 = in_stack_fffffffffffffe68;
        Untranslated(&local_78,original_03);
        bilingual_str::operator=(error,&local_78);
        bilingual_str::~bilingual_str(&local_78);
        this_00 = &local_178;
      }
      goto LAB_009cba61;
    }
    std::filesystem::__cxx11::path::string(local_b8,&path->super_path);
    tinyformat::format<std::__cxx11::string>
              (&local_158,
               (tinyformat *)"Failed to create database path \'%s\'. Database already exists.",
               (char *)local_b8,args);
    original_01._M_string_length = (size_type)this;
    original_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
    original_01.field_2 = in_stack_fffffffffffffe68;
    Untranslated(&local_78,original_01);
    bilingual_str::operator=(error,&local_78);
    bilingual_str::~bilingual_str(&local_78);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)local_b8);
    *status = FAILED_ALREADY_EXISTS;
  }
LAB_009cba7a:
  *(undefined8 *)this = 0;
LAB_009cbb9a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>,_true,_true>
          )(tuple<wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>)this;
}

Assistant:

std::unique_ptr<WalletDatabase> MakeDatabase(const fs::path& path, const DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error)
{
    bool exists;
    try {
        exists = fs::symlink_status(path).type() != fs::file_type::not_found;
    } catch (const fs::filesystem_error& e) {
        error = Untranslated(strprintf("Failed to access database path '%s': %s", fs::PathToString(path), fsbridge::get_filesystem_error_message(e)));
        status = DatabaseStatus::FAILED_BAD_PATH;
        return nullptr;
    }

    std::optional<DatabaseFormat> format;
    if (exists) {
        if (IsBDBFile(BDBDataFile(path))) {
            format = DatabaseFormat::BERKELEY;
        }
        if (IsSQLiteFile(SQLiteDataFile(path))) {
            if (format) {
                error = Untranslated(strprintf("Failed to load database path '%s'. Data is in ambiguous format.", fs::PathToString(path)));
                status = DatabaseStatus::FAILED_BAD_FORMAT;
                return nullptr;
            }
            format = DatabaseFormat::SQLITE;
        }
    } else if (options.require_existing) {
        error = Untranslated(strprintf("Failed to load database path '%s'. Path does not exist.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_NOT_FOUND;
        return nullptr;
    }

    if (!format && options.require_existing) {
        error = Untranslated(strprintf("Failed to load database path '%s'. Data is not in recognized format.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_BAD_FORMAT;
        return nullptr;
    }

    if (format && options.require_create) {
        error = Untranslated(strprintf("Failed to create database path '%s'. Database already exists.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_ALREADY_EXISTS;
        return nullptr;
    }

    // If BERKELEY was the format, then change the format from BERKELEY to BERKELEY_RO
    if (format && options.require_format && format == DatabaseFormat::BERKELEY && options.require_format == DatabaseFormat::BERKELEY_RO) {
        format = DatabaseFormat::BERKELEY_RO;
    }

    // A db already exists so format is set, but options also specifies the format, so make sure they agree
    if (format && options.require_format && format != options.require_format) {
        error = Untranslated(strprintf("Failed to load database path '%s'. Data is not in required format.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_BAD_FORMAT;
        return nullptr;
    }

    // Format is not set when a db doesn't already exist, so use the format specified by the options if it is set.
    if (!format && options.require_format) format = options.require_format;

    // If the format is not specified or detected, choose the default format based on what is available. We prefer BDB over SQLite for now.
    if (!format) {
#ifdef USE_SQLITE
        format = DatabaseFormat::SQLITE;
#endif
#ifdef USE_BDB
        format = DatabaseFormat::BERKELEY;
#endif
    }

    if (format == DatabaseFormat::SQLITE) {
#ifdef USE_SQLITE
        if constexpr (true) {
            return MakeSQLiteDatabase(path, options, status, error);
        } else
#endif
        {
            error = Untranslated(strprintf("Failed to open database path '%s'. Build does not support SQLite database format.", fs::PathToString(path)));
            status = DatabaseStatus::FAILED_BAD_FORMAT;
            return nullptr;
        }
    }

    if (format == DatabaseFormat::BERKELEY_RO) {
        return MakeBerkeleyRODatabase(path, options, status, error);
    }

#ifdef USE_BDB
    if constexpr (true) {
        return MakeBerkeleyDatabase(path, options, status, error);
    } else
#endif
    {
        error = Untranslated(strprintf("Failed to open database path '%s'. Build does not support Berkeley DB database format.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_BAD_FORMAT;
        return nullptr;
    }
}